

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O2

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::mrg3s>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,mrg3s *r1,mrg3s *r2,long N,long skip1,long skip2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  result_type local_84;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_80;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_58;
  long local_40;
  long local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)&local_58,N);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)&local_78,N);
  }
  lVar1 = 0;
  local_38 = skip1;
  if (skip1 < 1) {
    local_38 = lVar1;
  }
  local_40 = skip2;
  if (skip2 < 1) {
    local_40 = lVar1;
  }
  if (N < 1) {
    N = lVar1;
  }
  for (; lVar1 != N; lVar1 = lVar1 + 1) {
    local_84 = trng::mrg3s::operator()(r1);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_58,&local_84);
    local_84 = trng::mrg3s::operator()(r2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_84);
    lVar2 = local_38;
    while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, lVar3 = local_40, bVar4) {
      trng::mrg3s::operator()(r1);
    }
    while (lVar3 != 0) {
      trng::mrg3s::operator()(r2);
      lVar3 = lVar3 + -1;
    }
  }
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_80,(vector<int,_std::allocator<int>_> *)&local_58,
             (vector<int,_std::allocator<int>_> *)&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         local_80;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}